

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O2

int lws_buflist_append_segment(lws_buflist **head,uint8_t *buf,size_t len)

{
  lws_buflist *plVar1;
  uint __line;
  int iVar2;
  lws_buflist *plVar3;
  lws_buflist *plVar4;
  char *pcVar5;
  
  plVar1 = *head;
  if (buf == (uint8_t *)0x0) {
    pcVar5 = "buf";
    __line = 0x2a;
  }
  else {
    if (len != 0) {
      iVar2 = -0x400;
      plVar3 = plVar1;
      do {
        plVar4 = plVar3;
        if (plVar4 == (lws_buflist *)0x0) {
          _lws_log(8,"%s: len %u first %d %p\n","lws_buflist_append_segment",len & 0xffffffff,
                   (ulong)(plVar1 == (lws_buflist *)0x0));
          plVar3 = (lws_buflist *)lws_realloc((void *)0x0,len + 0x29,"lws_buflist_append_segment");
          if (plVar3 != (lws_buflist *)0x0) {
            plVar3->len = len;
            plVar3->pos = 0;
            plVar3->next = (lws_buflist *)0x0;
            memcpy(&plVar3[1].pos,buf,len);
            ((lws_buflist *)head)->next = plVar3;
            return (uint)(plVar1 == (lws_buflist *)0x0);
          }
          pcVar5 = "%s: OOM\n";
          goto LAB_00135d11;
        }
        iVar2 = iVar2 + 1;
        if (iVar2 == 0) {
          pcVar5 = "%s: buflist reached sanity limit\n";
          goto LAB_00135d11;
        }
        plVar3 = plVar4->next;
        head = &plVar4->next;
      } while (plVar4 != plVar4->next);
      pcVar5 = "%s: corrupt list points to self\n";
LAB_00135d11:
      _lws_log(1,pcVar5,"lws_buflist_append_segment");
      return -1;
    }
    pcVar5 = "len";
    __line = 0x2b;
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/buflist.c"
                ,__line,
                "int lws_buflist_append_segment(struct lws_buflist **, const uint8_t *, size_t)");
}

Assistant:

int
lws_buflist_append_segment(struct lws_buflist **head, const uint8_t *buf,
			   size_t len)
{
	struct lws_buflist *nbuf;
	int first = !*head;
	void *p = *head;
	int sanity = 1024;

	assert(buf);
	assert(len);

	/* append at the tail */
	while (*head) {
		if (!--sanity) {
			lwsl_err("%s: buflist reached sanity limit\n", __func__);
			return -1;
		}
		if (*head == (*head)->next) {
			lwsl_err("%s: corrupt list points to self\n", __func__);
			return -1;
		}
		head = &((*head)->next);
	}

	(void)p;
	lwsl_info("%s: len %u first %d %p\n", __func__, (unsigned int)len,
					      first, p);

	nbuf = (struct lws_buflist *)lws_malloc(sizeof(struct lws_buflist) +
						len + LWS_PRE + 1, __func__);
	if (!nbuf) {
		lwsl_err("%s: OOM\n", __func__);
		return -1;
	}

	nbuf->len = len;
	nbuf->pos = 0;
	nbuf->next = NULL;

	/* whoever consumes this might need LWS_PRE from the start... */
	p = (uint8_t *)nbuf + sizeof(*nbuf) + LWS_PRE;
	memcpy(p, buf, len);

	*head = nbuf;

	return first; /* returns 1 if first segment just created */
}